

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileByName(DescriptorPool *this,string *name)

{
  bool bVar1;
  const_iterator cVar2;
  FileDescriptor *pFVar3;
  MutexLockMaybe lock;
  MutexLockMaybe local_28;
  pointer local_20;
  
  internal::MutexLockMaybe::MutexLockMaybe(&local_28,this->mutex_);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_files_)._M_h);
  }
  local_20 = (name->_M_dataplus)._M_p;
  cVar2 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(((this->tables_)._M_t.
                    super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                   _M_head_impl)->files_by_name_)._M_h,&local_20);
  if ((cVar2.
       super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
       ._M_cur == (__node_type *)0x0) ||
     (pFVar3 = *(FileDescriptor **)
                ((long)cVar2.
                       super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                       ._M_cur + 0x10), pFVar3 == (FileDescriptor *)0x0)) {
    if (this->underlay_ != (DescriptorPool *)0x0) {
      pFVar3 = FindFileByName(this->underlay_,name);
      if (pFVar3 != (FileDescriptor *)0x0) goto LAB_002c2f92;
    }
    bVar1 = TryFindFileInFallbackDatabase(this,name);
    if (bVar1) {
      local_20 = (name->_M_dataplus)._M_p;
      cVar2 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(((this->tables_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                       _M_head_impl)->files_by_name_)._M_h,&local_20);
      if ((cVar2.
           super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
           ._M_cur != (__node_type *)0x0) &&
         (pFVar3 = *(FileDescriptor **)
                    ((long)cVar2.
                           super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                           ._M_cur + 0x10), pFVar3 != (FileDescriptor *)0x0)) goto LAB_002c2f92;
    }
    pFVar3 = (FileDescriptor *)0x0;
  }
LAB_002c2f92:
  if ((pthread_mutex_t *)local_28.mu_ != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)local_28.mu_);
  }
  return pFVar3;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileByName(
    const std::string& name) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  const FileDescriptor* result = tables_->FindFile(name);
  if (result != nullptr) return result;
  if (underlay_ != nullptr) {
    result = underlay_->FindFileByName(name);
    if (result != nullptr) return result;
  }
  if (TryFindFileInFallbackDatabase(name)) {
    result = tables_->FindFile(name);
    if (result != nullptr) return result;
  }
  return nullptr;
}